

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenMemoryCopy(BinaryenModuleRef module,BinaryenExpressionRef dest,BinaryenExpressionRef source,
                  BinaryenExpressionRef size,char *destMemory,char *sourceMemory)

{
  char *size_00;
  BinaryenExpressionRef source_00;
  BinaryenExpressionRef dest_00;
  MemoryCopy *pMVar1;
  Name destMemory_00;
  Name sourceMemory_00;
  Builder local_40;
  char *local_38;
  char *sourceMemory_local;
  char *destMemory_local;
  BinaryenExpressionRef size_local;
  BinaryenExpressionRef source_local;
  BinaryenExpressionRef dest_local;
  BinaryenModuleRef module_local;
  
  local_38 = sourceMemory;
  sourceMemory_local = destMemory;
  destMemory_local = (char *)size;
  size_local = source;
  source_local = dest;
  dest_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_40,module);
  dest_00 = source_local;
  source_00 = size_local;
  size_00 = destMemory_local;
  destMemory_00 = getMemoryName((BinaryenModuleRef)dest_local,sourceMemory_local);
  sourceMemory_00 = getMemoryName((BinaryenModuleRef)dest_local,local_38);
  pMVar1 = wasm::Builder::makeMemoryCopy
                     (&local_40,dest_00,source_00,(Expression *)size_00,destMemory_00,
                      sourceMemory_00);
  return (BinaryenExpressionRef)pMVar1;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryCopy(BinaryenModuleRef module,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef source,
                                         BinaryenExpressionRef size,
                                         const char* destMemory,
                                         const char* sourceMemory) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryCopy((Expression*)dest,
                      (Expression*)source,
                      (Expression*)size,
                      getMemoryName(module, destMemory),
                      getMemoryName(module, sourceMemory)));
}